

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::HardSwish_x86_avx::forward_inplace(HardSwish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [32];
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  undefined1 auVar8 [32];
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [32];
  long lVar13;
  long lVar14;
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  float fVar20;
  undefined1 auVar21 [16];
  
  iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  auVar16._16_4_ = 0x3f800000;
  auVar16._20_4_ = 0x3f800000;
  auVar16._24_4_ = 0x3f800000;
  auVar16._28_4_ = 0x3f800000;
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = 0x3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  do {
    if (uVar11 == uVar10) {
      return 0;
    }
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar12 = (undefined1 (*) [32])(sVar5 * uVar11 * sVar4 + (long)pvVar3);
    pp_Var6 = this->_vptr_HardSwish_x86_avx;
    lVar13 = 0;
    for (iVar15 = 0; iVar15 + 7 < iVar9; iVar15 = iVar15 + 8) {
      fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var6[-3]);
      auVar2 = *pauVar12;
      fVar20 = *(float *)(&this->field_0xd0 + (long)pp_Var6[-3]);
      auVar19._0_4_ = fVar20 * auVar2._0_4_ + fVar1;
      auVar19._4_4_ = fVar20 * auVar2._4_4_ + fVar1;
      auVar19._8_4_ = fVar20 * auVar2._8_4_ + fVar1;
      auVar19._12_4_ = fVar20 * auVar2._12_4_ + fVar1;
      auVar19._16_4_ = fVar20 * auVar2._16_4_ + fVar1;
      auVar19._20_4_ = fVar20 * auVar2._20_4_ + fVar1;
      auVar19._24_4_ = fVar20 * auVar2._24_4_ + fVar1;
      auVar19._28_4_ = fVar20 + fVar1;
      auVar19 = vmaxps_avx(auVar19,ZEXT1632(ZEXT816(0) << 0x40));
      auVar19 = vminps_avx(auVar19,auVar16);
      auVar8._4_4_ = auVar19._4_4_ * auVar2._4_4_;
      auVar8._0_4_ = auVar19._0_4_ * auVar2._0_4_;
      auVar8._8_4_ = auVar19._8_4_ * auVar2._8_4_;
      auVar8._12_4_ = auVar19._12_4_ * auVar2._12_4_;
      auVar8._16_4_ = auVar19._16_4_ * auVar2._16_4_;
      auVar8._20_4_ = auVar19._20_4_ * auVar2._20_4_;
      auVar8._24_4_ = auVar19._24_4_ * auVar2._24_4_;
      auVar8._28_4_ = auVar19._28_4_;
      *pauVar12 = auVar8;
      pauVar12 = pauVar12 + 1;
      lVar13 = lVar13 + 8;
    }
    pp_Var6 = this->_vptr_HardSwish_x86_avx;
    for (; iVar15 + 3 < iVar9; iVar15 = iVar15 + 4) {
      fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var6[-3]);
      fVar20 = *(float *)(&this->field_0xd0 + (long)pp_Var6[-3]);
      auVar21._0_4_ = fVar20 * *(float *)*pauVar12 + fVar1;
      auVar21._4_4_ = fVar20 * *(float *)(*pauVar12 + 4) + fVar1;
      auVar21._8_4_ = fVar20 * *(float *)(*pauVar12 + 8) + fVar1;
      auVar21._12_4_ = fVar20 * *(float *)(*pauVar12 + 0xc) + fVar1;
      auVar21 = vmaxps_avx(auVar21,ZEXT816(0) << 0x40);
      auVar21 = vminps_avx(auVar21,auVar17);
      auVar18._0_4_ = auVar21._0_4_ * *(float *)*pauVar12;
      auVar18._4_4_ = auVar21._4_4_ * *(float *)(*pauVar12 + 4);
      auVar18._8_4_ = auVar21._8_4_ * *(float *)(*pauVar12 + 8);
      auVar18._12_4_ = auVar21._12_4_ * *(float *)(*pauVar12 + 0xc);
      *(undefined1 (*) [16])*pauVar12 = auVar18;
      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
      lVar13 = lVar13 + 4;
    }
    pp_Var6 = this->_vptr_HardSwish_x86_avx;
    lVar14 = sVar5 * sVar4 * uVar11;
    for (; (int)lVar13 < iVar9; lVar13 = lVar13 + 1) {
      fVar1 = *(float *)((long)pvVar3 + lVar13 * 4 + lVar14);
      p_Var7 = pp_Var6[-3];
      fVar20 = 0.0;
      if (fVar1 < *(float *)(&this->field_0xd8 + (long)p_Var7)) {
LAB_004497ea:
        *(float *)((long)pvVar3 + lVar13 * 4 + lVar14) = fVar20;
      }
      else if (fVar1 <= *(float *)(&this->field_0xdc + (long)p_Var7)) {
        fVar20 = (fVar1 * *(float *)(&this->field_0xd0 + (long)p_Var7) +
                 *(float *)(&this->field_0xd4 + (long)p_Var7)) * fVar1;
        goto LAB_004497ea;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

int HardSwish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}